

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O1

void printThumbAddrModeRROperand(MCInst *MI,uint Op,SStream *O)

{
  uint8_t *puVar1;
  cs_struct *pcVar2;
  cs_detail *pcVar3;
  _Bool _Var4;
  uint uVar5;
  MCOperand *op;
  MCOperand *op_00;
  char *pcVar6;
  undefined4 in_register_00000034;
  SStream *O_00;
  
  O_00 = (SStream *)CONCAT44(in_register_00000034,Op);
  op = MCInst_getOperand(MI,1);
  op_00 = MCInst_getOperand(MI,2);
  _Var4 = MCOperand_isReg(op);
  if (_Var4) {
    SStream_concat0(O_00,"[");
    set_mem_access(MI,true);
    pcVar2 = MI->csh;
    uVar5 = MCOperand_getReg(op);
    pcVar6 = (*pcVar2->get_regname)(uVar5);
    SStream_concat0(O_00,pcVar6);
    if (MI->csh->detail != CS_OPT_OFF) {
      uVar5 = MCOperand_getReg(op);
      pcVar3 = MI->flat_insn->detail;
      *(uint *)(pcVar3->groups + (ulong)((uint)(pcVar3->field_6).arm.op_count * 0x30) + 0x45) =
           uVar5;
    }
    uVar5 = MCOperand_getReg(op_00);
    if (uVar5 != 0) {
      SStream_concat0(O_00,", ");
      pcVar6 = (*MI->csh->get_regname)(uVar5);
      SStream_concat0(O_00,pcVar6);
      if (MI->csh->detail != CS_OPT_OFF) {
        pcVar3 = MI->flat_insn->detail;
        *(uint *)(pcVar3->groups + (ulong)((uint)(pcVar3->field_6).arm.op_count * 0x30) + 0x49) =
             uVar5;
      }
    }
    SStream_concat0(O_00,"]");
    if (MI->csh->detail == CS_OPT_ON) {
      MI->csh->doing_mem = false;
      puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
      *puVar1 = *puVar1 + '\x01';
    }
    return;
  }
  printOperand(MI,1,O_00);
  return;
}

Assistant:

static void printThumbAddrModeRROperand(MCInst *MI, unsigned Op, SStream *O)
{
	MCOperand *MO1 = MCInst_getOperand(MI, Op);
	MCOperand *MO2 = MCInst_getOperand(MI, Op + 1);
	unsigned RegNum;

	if (!MCOperand_isReg(MO1)) {   // FIXME: This is for CP entries, but isn't right.
		printOperand(MI, Op, O);
		return;
	}

	SStream_concat0(O, "[");
	set_mem_access(MI, true);
	printRegName(MI->csh, O, MCOperand_getReg(MO1));
	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.base = MCOperand_getReg(MO1);
	RegNum = MCOperand_getReg(MO2);
	if (RegNum) {
		SStream_concat0(O, ", ");
		printRegName(MI->csh, O, RegNum);
		if (MI->csh->detail)
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.index = RegNum;
	}
	SStream_concat0(O, "]");
	set_mem_access(MI, false);
}